

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O0

void nn_btcp_start_accepting(nn_btcp *self)

{
  void *pvVar1;
  nn_usock *in_RDI;
  int in_stack_0000000c;
  nn_atcp *in_stack_00000010;
  
  if (in_RDI[1].in.len != 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","self->atcp == NULL",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,400);
    fflush(_stderr);
    nn_err_abort();
  }
  pvVar1 = nn_alloc_(0x16bb04);
  in_RDI[1].in.len = (size_t)pvVar1;
  if (in_RDI[1].in.len == 0) {
    nn_backtrace_print();
    fprintf(_stderr,"Out of memory (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/tcp/btcp.c"
            ,0x194);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_atcp_init(in_stack_00000010,in_stack_0000000c,(nn_ep *)self,&in_RDI->fsm);
  nn_atcp_start((nn_atcp *)self,in_RDI);
  return;
}

Assistant:

static void nn_btcp_start_accepting (struct nn_btcp *self)
{
    nn_assert (self->atcp == NULL);

    /*  Allocate new atcp state machine. */
    self->atcp = nn_alloc (sizeof (struct nn_atcp), "atcp");
    alloc_assert (self->atcp);
    nn_atcp_init (self->atcp, NN_BTCP_SRC_ATCP, self->ep, &self->fsm);

    /*  Start waiting for a new incoming connection. */
    nn_atcp_start (self->atcp, &self->usock);
}